

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtHelper.cpp
# Opt level: O3

bool InitializeProcess(void)

{
  HMODULE hMod;
  undefined1 local_38 [8];
  CmdLineArgsParser parser;
  
  pthread_key_create(&s_threadLocalDummy,DISPOSE_CHAKRA_CORE_THREAD);
  PAL_atexit(InitializeProcess::anon_class_1_0_00000001::__invoke);
  PAL_InitializeChakraCore();
  hMod = GetModuleHandleW((LPCWSTR)0x0);
  AutoSystemInfo::SaveModuleFileName(hMod);
  CmdLineArgsParser::CmdLineArgsParser
            ((CmdLineArgsParser *)local_38,(ICustomConfigFlags *)0x0,
             (ConfigFlagsTable *)&Js::Configuration::Global);
  ConfigParser::ParseOnModuleLoad((CmdLineArgsParser *)local_38,hMod);
  CmdLineArgsParser::~CmdLineArgsParser((CmdLineArgsParser *)local_38);
  VTuneChakraProfile::Register();
  ValueType::Initialize();
  ThreadContext::GlobalInitialize();
  DynamicProfileStorage::Initialize();
  return true;
}

Assistant:

_NOINLINE bool InitializeProcess()
    {
#if !defined(_WIN32)
        pthread_key_create(&s_threadLocalDummy, DISPOSE_CHAKRA_CORE_THREAD);
#endif

    // setup the cleanup
    // we do not track the main thread. When it exits do the cleanup below
#if defined(CHAKRA_STATIC_LIBRARY) || !defined(_WIN32)
    atexit([]() {
        ThreadBoundThreadContextManager::DestroyContextAndEntryForCurrentThread();

#ifdef DYNAMIC_PROFILE_STORAGE
        DynamicProfileStorage::Uninitialize();
#endif
        JsrtRuntime::Uninitialize();

        // thread-bound entrypoint should be able to get cleanup correctly, however tlsentry
        // for current thread might be left behind if this thread was initialized.
        ThreadContextTLSEntry::CleanupThread();
        ThreadContextTLSEntry::CleanupProcess();
    });
#endif

#ifndef _WIN32
        PAL_InitializeChakraCore();
#endif

        HMODULE mod = GetModuleHandleW(NULL);
        AutoSystemInfo::SaveModuleFileName(mod);

    #if defined(_M_IX86) && !defined(__clang__)
        // Enable SSE2 math functions in CRT if SSE2 is available
    #pragma prefast(suppress:6031, "We don't require SSE2, but will use it if available")
        _set_SSE2_enable(TRUE);
    #endif

        {
            CmdLineArgsParser parser;
            ConfigParser::ParseOnModuleLoad(parser, mod);
        }

    #if defined(ENABLE_JS_ETW) && !defined(ENABLE_JS_LTTNG)
        EtwTrace::Register();
    #endif
    #ifdef VTUNE_PROFILING
        VTuneChakraProfile::Register();
    #endif
#if PERFMAP_TRACE_ENABLED
        PlatformAgnostic::PerfTrace::Register();
#endif

        ValueType::Initialize();
        ThreadContext::GlobalInitialize();

    #ifdef ENABLE_BASIC_TELEMETRY
        g_TraceLoggingClient = NoCheckHeapNewStruct(TraceLoggingClient);
    #endif

    #ifdef DYNAMIC_PROFILE_STORAGE
        DynamicProfileStorage::Initialize();
    #endif

        return true;
    }